

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateReturnStatement
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *commandName,
          CommandData *commandData,string *returnVariable,string *returnType,
          string *decoratedReturnType,string *dataType,size_t initialSkipCount,size_t returnParam,
          CommandFlavourFlags flavourFlags,bool enumerating,bool raii)

{
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  long lVar2;
  VulkanHppGenerator *pVVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  undefined1 local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Base_ptr local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pbVar5 = &bStack_118;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = &commandData->returnType;
  local_78 = (_Base_ptr)commandName;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with(this_00,"Vk");
  if (bVar1) {
    __lhs = (commandData->successCodes).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(commandData->successCodes).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)__lhs;
    if (lVar2 != 0x20 && (!enumerating || lVar2 != 0x40)) {
      if (returnVariable->_M_string_length == 0) {
        if ((flavourFlags.m_mask & 8) != 0) {
          __assert_fail("!unique",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x29a2,
                        "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                       );
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,"Vk",(allocator<char> *)(local_b8 + 0x20));
        stripPrefix(&local_d8,this_00,(string *)local_b8);
        std::operator+(&bStack_118,"return static_cast<VULKAN_HPP_NAMESPACE::",&local_d8);
        std::operator+(&local_f8,&bStack_118,">( result );");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&bStack_118);
        std::__cxx11::string::~string((string *)&local_d8);
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
        goto LAB_00138f04;
      }
      if ((flavourFlags.m_mask & 8) == 0) {
        pcVar4 = "std::pair<VULKAN_HPP_NAMESPACE::Result, ";
        if (!raii) {
          pcVar4 = "ResultValue<";
        }
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(decoratedReturnType,pcVar4);
        if ((bVar1) &&
           (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::ends_with(decoratedReturnType,">"), bVar1)) {
          if (raii) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(local_b8 + 0x20),"std::make_pair",(allocator<char> *)&local_70);
          }
          else {
            std::__cxx11::string::string((string *)(local_b8 + 0x20),decoratedReturnType);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,"return ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_b8 + 0x20));
          std::operator+(&local_d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,"( result, std::move( ");
          std::operator+(&bStack_118,&local_d8,returnVariable);
          std::operator+(&local_f8,&bStack_118," ) );");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&bStack_118);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)local_b8);
          std::__cxx11::string::~string((string *)(local_b8 + 0x20));
          return __return_storage_ptr__;
        }
        __assert_fail("decoratedReturnType.starts_with( raii ? \"std::pair<VULKAN_HPP_NAMESPACE::Result, \" : \"ResultValue<\" ) && decoratedReturnType.ends_with( \">\" )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x29b7,
                      "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                     );
      }
      if (returnParam == 0xffffffffffffffff) {
        __assert_fail("returnParam != INVALID_INDEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x29a7,
                      "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                     );
      }
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              starts_with(decoratedReturnType,"ResultValue<");
      if ((!bVar1) ||
         (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  ends_with(decoratedReturnType,">"), !bVar1)) {
        __assert_fail("decoratedReturnType.starts_with( \"ResultValue<\" ) && decoratedReturnType.ends_with( \">\" )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x29a8,
                      "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                     );
      }
      std::operator+(&bStack_118,"return ",decoratedReturnType);
      std::operator+(&local_f8,&bStack_118,"( result, ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&bStack_118);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              starts_with(dataType,"std::");
      if (!bVar1) {
        std::operator+(&local_70,"UniqueHandle<",dataType);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_b8 + 0x20),&local_70,", Dispatch>( ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_b8 + 0x20),returnVariable);
        pVVar3 = (VulkanHppGenerator *)local_b8;
        std::operator+(&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar3,
                       ", ");
        generateObjectDeleter
                  (&local_50,pVVar3,(string *)local_78,commandData,initialSkipCount,returnParam);
        std::operator+(&bStack_118,&local_d8,&local_50);
        std::operator+(&local_f8,&bStack_118," )");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&bStack_118);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)(local_b8 + 0x20));
        pbVar5 = &local_70;
        goto LAB_001392f4;
      }
      anon_unknown.dwarf_dd40c::startUpperCase(&local_d8,returnVariable);
      std::operator+(&bStack_118,"std::move( unique",&local_d8);
      std::operator+(&local_f8,&bStack_118," )");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_f8);
LAB_001392dd:
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&bStack_118);
      pbVar5 = &local_d8;
LAB_001392f4:
      std::__cxx11::string::~string((string *)pbVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__," );");
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==(__lhs,"VK_SUCCESS");
    if (!bVar1) {
      __assert_fail("commandData.successCodes[0] == \"VK_SUCCESS\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2979,
                    "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                   );
    }
    if ((raii) ||
       ((commandData->errorCodes).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (commandData->errorCodes).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      if (returnVariable->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      std::operator+(&bStack_118,"return ",returnVariable);
      std::operator+(&local_f8,&bStack_118,";");
    }
    else {
      if (returnVariable->_M_string_length == 0) {
        if ((flavourFlags.m_mask & 8) != 0) {
          __assert_fail("!unique",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x2985,
                        "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                       );
        }
        pcVar4 = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result );";
        goto LAB_0013925a;
      }
      if ((flavourFlags.m_mask & 8) != 0) {
        if (returnParam == 0xffffffffffffffff) {
          __assert_fail("returnParam != INVALID_INDEX",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x298a,
                        "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                       );
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (__return_storage_ptr__,
                   "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, ");
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(dataType,"std::");
        if (!bVar1) {
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  starts_with(dataType,"VULKAN_HPP_NAMESPACE::");
          if (!bVar1) {
            __assert_fail("dataType.starts_with( \"VULKAN_HPP_NAMESPACE::\" )",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x2992,
                          "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                         );
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_b8 + 0x20),returnType,"( ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_b8 + 0x20),returnVariable);
          pVVar3 = (VulkanHppGenerator *)local_b8;
          std::operator+(&local_d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar3
                         ,", ");
          generateObjectDeleter
                    (&local_70,pVVar3,(string *)local_78,commandData,initialSkipCount,returnParam);
          std::operator+(&bStack_118,&local_d8,&local_70);
          std::operator+(&local_f8,&bStack_118," )");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&bStack_118);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)local_b8);
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b8 + 0x20);
          goto LAB_001392f4;
        }
        anon_unknown.dwarf_dd40c::startUpperCase(&local_d8,returnVariable);
        std::operator+(&bStack_118,"std::move( unique",&local_d8);
        std::operator+(&local_f8,&bStack_118," )");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_f8);
        goto LAB_001392dd;
      }
      std::operator+(&bStack_118,
                     "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, std::move( "
                     ,returnVariable);
      std::operator+(&local_f8,&bStack_118," ) );");
    }
  }
  else {
    if ((flavourFlags.m_mask & 8) != 0) {
      __assert_fail("!unique",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x29be,
                    "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                   );
    }
    if (returnVariable->_M_string_length == 0) {
      bVar1 = std::operator==(this_00,"void");
      if (bVar1) {
        return __return_storage_ptr__;
      }
      pcVar4 = "return result;";
LAB_0013925a:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (__return_storage_ptr__,pcVar4);
      return __return_storage_ptr__;
    }
    std::operator+(&bStack_118,"return ",returnVariable);
    std::operator+(&local_f8,&bStack_118,";");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (__return_storage_ptr__,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
LAB_00138f04:
  std::__cxx11::string::~string((string *)pbVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateReturnStatement( std::string const & commandName,
                                                         CommandData const & commandData,
                                                         std::string const & returnVariable,
                                                         std::string const & returnType,
                                                         std::string const & decoratedReturnType,
                                                         std::string const & dataType,
                                                         size_t              initialSkipCount,
                                                         size_t              returnParam,
                                                         CommandFlavourFlags flavourFlags,
                                                         bool                enumerating,
                                                         bool                raii ) const
{
  const bool unique = flavourFlags & CommandFlavourFlagBits::unique;

  std::string returnStatement;
  if ( commandData.returnType.starts_with( "Vk" ) )
  {
    if ( ( commandData.successCodes.size() == 1 ) || ( enumerating && ( commandData.successCodes.size() == 2 ) ) )
    {
      assert( commandData.successCodes[0] == "VK_SUCCESS" );
      if ( raii || commandData.errorCodes.empty() )
      {
        if ( !returnVariable.empty() )
        {
          returnStatement = "return " + returnVariable + ";";
        }
      }
      else
      {
        if ( returnVariable.empty() )
        {
          assert( !unique );
          returnStatement = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result );";
        }
        else if ( unique )
        {
          assert( returnParam != INVALID_INDEX );
          returnStatement = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, ";
          if ( dataType.starts_with( "std::" ) )
          {
            returnStatement += "std::move( unique" + startUpperCase( returnVariable ) + " )";
          }
          else
          {
            assert( dataType.starts_with( "VULKAN_HPP_NAMESPACE::" ) );
            returnStatement +=
              returnType + "( " + returnVariable + ", " + generateObjectDeleter( commandName, commandData, initialSkipCount, returnParam ) + " )";
          }
          returnStatement += " );";
        }
        else
        {
          returnStatement = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, std::move( " + returnVariable + " ) );";
        }
      }
    }
    else
    {
      if ( returnVariable.empty() )
      {
        assert( !unique );
        returnStatement = "return static_cast<VULKAN_HPP_NAMESPACE::" + stripPrefix( commandData.returnType, "Vk" ) + ">( result );";
      }
      else if ( unique )
      {
        assert( returnParam != INVALID_INDEX );
        assert( decoratedReturnType.starts_with( "ResultValue<" ) && decoratedReturnType.ends_with( ">" ) );
        returnStatement = "return " + decoratedReturnType + "( result, ";
        if ( dataType.starts_with( "std::" ) )
        {
          returnStatement += "std::move( unique" + startUpperCase( returnVariable ) + " )";
        }
        else
        {
          returnStatement += "UniqueHandle<" + dataType + ", Dispatch>( " + returnVariable + ", " +
                             generateObjectDeleter( commandName, commandData, initialSkipCount, returnParam ) + " )";
        }
        returnStatement += " );";
      }
      else
      {
        assert( decoratedReturnType.starts_with( raii ? "std::pair<VULKAN_HPP_NAMESPACE::Result, " : "ResultValue<" ) && decoratedReturnType.ends_with( ">" ) );
        returnStatement = "return " + ( raii ? "std::make_pair" : decoratedReturnType ) + "( result, std::move( " + returnVariable + " ) );";
      }
    }
  }
  else
  {
    assert( !unique );
    if ( returnVariable.empty() )
    {
      if ( commandData.returnType != "void" )
      {
        returnStatement = "return result;";
      }
    }
    else
    {
      returnStatement = "return " + returnVariable + ";";
    }
  }
  return returnStatement;
}